

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::FieldName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field)

{
  ushort *puVar1;
  pointer pcVar2;
  java *this_00;
  bool bVar3;
  int iVar4;
  Descriptor *pDVar5;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  *prVar6;
  long lVar7;
  undefined8 *puVar8;
  char **ppcVar9;
  undefined1 in_R8B;
  hasher *hash;
  byte bVar10;
  string_view input;
  iterator iVar11;
  allocator_type local_73;
  key_equal local_72;
  hasher local_71;
  undefined1 local_70 [72];
  
  bVar10 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar3 = protobuf::internal::cpp::IsGroupLike((FieldDescriptor *)this);
  if (bVar3) {
    pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)this);
    puVar1 = (ushort *)(pDVar5->all_names_).payload_;
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,(long)puVar1 + ~(ulong)*puVar1,(long)puVar1 + -1);
  }
  else {
    puVar1 = *(ushort **)(this + 8);
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_70,~(ulong)*puVar1 + (long)puVar1,(long)puVar1 + -1);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_70);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  this_00 = (java *)__return_storage_ptr__->_M_string_length;
  if (IsForbidden(std::basic_string_view<char,std::char_traits<char>>)::kForbiddenNames == '\0') {
    iVar4 = __cxa_guard_acquire(&IsForbidden(std::basic_string_view<char,std::char_traits<char>>)::
                                 kForbiddenNames);
    if (iVar4 != 0) {
      prVar6 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)operator_new(0x20);
      puVar8 = &DAT_0196d7e0;
      ppcVar9 = (char **)local_70;
      for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
        *ppcVar9 = (char *)*puVar8;
        puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
        ppcVar9 = ppcVar9 + (ulong)bVar10 * -2 + 1;
      }
      hash = &local_71;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::raw_hash_set<char_const*const*>
                (prVar6,(char **)local_70,(char **)&stack0xffffffffffffffd8,0,hash,&local_72,
                 &local_73);
      in_R8B = SUB81(hash,0);
      IsForbidden(std::basic_string_view<char,std::char_traits<char>>)::kForbiddenNames = prVar6;
      __cxa_guard_release(&IsForbidden(std::basic_string_view<char,std::char_traits<char>>)::
                           kForbiddenNames);
    }
  }
  prVar6 = IsForbidden(std::basic_string_view<char,std::char_traits<char>>)::kForbiddenNames;
  input._M_str = (char *)0x1;
  input._M_len = (size_t)pcVar2;
  UnderscoresToCamelCase_abi_cxx11_((string *)local_70,this_00,input,(bool)in_R8B);
  iVar11 = absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
           ::find<std::__cxx11::string>
                     (prVar6,(key_arg<std::__cxx11::basic_string<char>_> *)local_70);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)prVar6);
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  if (iVar11.ctrl_ != (ctrl_t *)0x0) {
    local_70._0_8_ = (pointer)0x1;
    local_70._8_8_ = "#";
    absl::lts_20250127::StrAppend(__return_storage_ptr__,(AlphaNum *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldName(const FieldDescriptor* field) {
  std::string field_name;
  // Groups are hacky:  The name of the field is just the lower-cased name
  // of the group type.  In Java, though, we would like to retain the original
  // capitalization of the type name.
  if (internal::cpp::IsGroupLike(*field)) {
    field_name = std::string(field->message_type()->name());
  } else {
    field_name = std::string(field->name());
  }
  if (IsForbidden(field_name)) {
    // Append a trailing "#" to indicate that the name should be decorated to
    // avoid collision with other names.
    absl::StrAppend(&field_name, "#");
  }
  return field_name;
}